

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O3

string * __thiscall
ZXing::OneD::DataBar::DecodeExpandedBits_abi_cxx11_
          (string *__return_storage_ptr__,DataBar *this,BitArray *_bits)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  BitArrayView *pBVar5;
  long *plVar6;
  char y;
  uint uVar7;
  int len;
  undefined8 in_RCX;
  size_type *psVar8;
  char *aiPrefix;
  ulong uVar9;
  BitArrayView *bits_00;
  BitArrayView *bits_01;
  BitArrayView *bits_02;
  BitArrayView *pBVar10;
  BitArrayView *extraout_RDX;
  BitArrayView *extraout_RDX_00;
  BitArrayView *extraout_RDX_01;
  char *bits_03;
  uint uVar11;
  char *in_R8;
  string *buffer;
  BitArrayView bits;
  string header;
  BitArrayView local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  local_a0.cur._M_current = *(uchar **)this;
  uVar11 = 1;
  local_a0.bits = (BitArray *)this;
  BitArrayView::peakBits(&local_a0,1);
  local_a0.cur._M_current = local_a0.cur._M_current + 1;
  iVar2 = BitArrayView::peakBits(&local_a0,1);
  if (iVar2 == 1) {
    pBVar5 = BitArrayView::skipBits(&local_a0,1);
    BitArrayView::skipBits(pBVar5,2);
    uVar3 = BitArrayView::peakBits(pBVar5,4);
    (pBVar5->cur)._M_current = (pBVar5->cur)._M_current + 4;
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    if (9 < uVar4) {
      uVar9 = (ulong)uVar4;
      uVar1 = 4;
      do {
        uVar11 = uVar1;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_0015f929;
        }
        if (uVar7 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_0015f929;
        }
        if (uVar7 < 10000) goto LAB_0015f929;
        uVar9 = uVar9 / 10000;
        uVar1 = uVar11 + 4;
      } while (99999 < uVar7);
      uVar11 = uVar11 + 1;
    }
LAB_0015f929:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar11 - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_70._M_dataplus._M_p + (uVar3 >> 0x1f),uVar11,uVar4);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x196b9c);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_50.field_2._M_allocated_capacity = *psVar8;
      local_50.field_2._8_8_ = plVar6[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar8;
      local_50._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_50._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DecodeCompressedGTIN(&local_90,&local_50,pBVar5);
    pBVar10 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      pBVar10 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      pBVar10 = extraout_RDX_01;
    }
    DecodeGeneralPurposeBits_abi_cxx11_(&local_70,(DataBar *)pBVar5,pBVar10);
    std::operator+(__return_storage_ptr__,&local_90,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
LAB_0015fa3c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  iVar2 = BitArrayView::peakBits(&local_a0,2);
  if (iVar2 == 0) {
    pBVar5 = BitArrayView::skipBits(&local_a0,2);
    BitArrayView::skipBits(pBVar5,2);
    DecodeGeneralPurposeBits_abi_cxx11_(__return_storage_ptr__,(DataBar *)pBVar5,bits_01);
    return __return_storage_ptr__;
  }
  iVar2 = BitArrayView::peakBits(&local_a0,4);
  len = (int)in_RCX;
  if (iVar2 == 5) {
    pBVar5 = BitArrayView::skipBits(&local_a0,4);
    DecodeAI01GTIN_abi_cxx11_(__return_storage_ptr__,(DataBar *)pBVar5,bits_02);
    uVar4 = BitArrayView::peakBits(pBVar5,0xf);
    (pBVar5->cur)._M_current = (pBVar5->cur)._M_current + 0xf;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar11 = uVar4 - 10000;
    if ((int)uVar4 < 10000) {
      uVar11 = uVar4;
    }
    ToString<int,void>(&local_90,(ZXing *)(ulong)uVar11,6,len);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p)
    ;
    goto LAB_0015fa3c;
  }
  if (iVar2 == 4) {
    pBVar5 = BitArrayView::skipBits(&local_a0,4);
    DecodeAI01GTIN_abi_cxx11_(__return_storage_ptr__,(DataBar *)pBVar5,bits_00);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar11 = BitArrayView::peakBits(pBVar5,0xf);
    (pBVar5->cur)._M_current = (pBVar5->cur)._M_current + 0xf;
    ToString<int,void>(&local_90,(ZXing *)(ulong)uVar11,6,len);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p)
    ;
    goto LAB_0015fa3c;
  }
  iVar2 = BitArrayView::peakBits(&local_a0,5);
  y = (char)in_RCX;
  if (iVar2 == 0xd) {
    pBVar5 = BitArrayView::skipBits(&local_a0,5);
    pBVar10 = (BitArrayView *)0x33;
LAB_0015fa83:
    DecodeAI0139yx_abi_cxx11_(__return_storage_ptr__,(DataBar *)pBVar5,pBVar10,y);
    return __return_storage_ptr__;
  }
  if (iVar2 == 0xc) {
    pBVar5 = BitArrayView::skipBits(&local_a0,5);
    pBVar10 = (BitArrayView *)0x32;
    goto LAB_0015fa83;
  }
  iVar2 = BitArrayView::peakBits(&local_a0,7);
  local_a0.cur._M_current = local_a0.cur._M_current + 7;
  switch(iVar2) {
  case 0x38:
    bits_03 = "310";
    break;
  case 0x39:
    bits_03 = "320";
    break;
  case 0x3a:
    bits_03 = "310";
    goto LAB_0015fadf;
  case 0x3b:
    bits_03 = "320";
LAB_0015fadf:
    aiPrefix = "13";
    goto LAB_0015fb1f;
  case 0x3c:
    bits_03 = "310";
    goto LAB_0015fb08;
  case 0x3d:
    bits_03 = "320";
LAB_0015fb08:
    aiPrefix = "15";
    goto LAB_0015fb1f;
  case 0x3e:
    bits_03 = "310";
    goto LAB_0015fb18;
  case 0x3f:
    bits_03 = "320";
LAB_0015fb18:
    aiPrefix = "17";
    goto LAB_0015fb1f;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  aiPrefix = "11";
LAB_0015fb1f:
  DecodeAI013x0x1x_abi_cxx11_
            (__return_storage_ptr__,(DataBar *)&local_a0,(BitArrayView *)bits_03,aiPrefix,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string DecodeExpandedBits(const BitArray& _bits)
{
	auto bits = BitArrayView(_bits);
	bits.readBits(1); // skip linkage bit

	if (bits.peakBits(1) == 1)
		return DecodeAI01AndOtherAIs(bits.skipBits(1));

	if (bits.peakBits(2) == 0)
		return DecodeAnyAI(bits.skipBits(2));

	switch (bits.peakBits(4)) {
	case 4: return DecodeAI013103(bits.skipBits(4));
	case 5: return DecodeAI01320x(bits.skipBits(4));
	}

	switch (bits.peakBits(5)) {
	case 12: return DecodeAI0139yx(bits.skipBits(5), '2');
	case 13: return DecodeAI0139yx(bits.skipBits(5), '3');
	}

	switch (bits.readBits(7)) {
	case 56: return DecodeAI013x0x1x(bits, "310", "11");
	case 57: return DecodeAI013x0x1x(bits, "320", "11");
	case 58: return DecodeAI013x0x1x(bits, "310", "13");
	case 59: return DecodeAI013x0x1x(bits, "320", "13");
	case 60: return DecodeAI013x0x1x(bits, "310", "15");
	case 61: return DecodeAI013x0x1x(bits, "320", "15");
	case 62: return DecodeAI013x0x1x(bits, "310", "17");
	case 63: return DecodeAI013x0x1x(bits, "320", "17");
	}

	return {};
}